

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O0

void sys_faccessat(Process *proc,Args *args)

{
  int64_t iVar1;
  uint64_t uVar2;
  uint64_t addr;
  string local_80;
  path local_60;
  undefined1 local_40 [8];
  path path;
  int fd;
  Args *args_local;
  Process *proc_local;
  
  uVar2 = Args::operator[](args,0);
  iVar1 = args->PID;
  path.m_pathname.field_2._12_4_ = (int)uVar2;
  addr = Args::operator[](args,1);
  ReadString_abi_cxx11_(&local_80,(pid_t)iVar1,addr);
  boost::filesystem::path::path(&local_60,&local_80);
  Process::Normalise((path *)local_40,proc,(int)uVar2,&local_60);
  boost::filesystem::path::~path(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (-1 < args->Return) {
    Process::AddInput(proc,(path *)local_40);
  }
  boost::filesystem::path::~path((path *)local_40);
  return;
}

Assistant:

static void sys_faccessat(Process *proc, const Args &args)
{
  const int fd = args[0];
  const fs::path path = proc->Normalise(fd, ReadString(args.PID, args[1]));

  if (args.Return >= 0) {
    proc->AddInput(path);
  }
}